

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<UF>::FirstScan(PRED<UF> *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  Mat1i *pMVar7;
  Mat1b *pMVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  uint *puVar15;
  int iVar16;
  long lVar17;
  uint *puVar18;
  uint *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  int local_b0;
  long local_80;
  int local_78;
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar33 = 0;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  puVar15 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar16 = *(int *)&pMVar8->field_0xc;
  lVar27 = (long)iVar16;
  uVar6 = *(uint *)&pMVar8->field_0x8;
  lVar9 = *(long *)&pMVar8->field_0x10;
  plVar10 = *(long **)&pMVar8->field_0x48;
  lVar11 = *(long *)&pMVar7->field_0x10;
  plVar12 = *(long **)&pMVar7->field_0x48;
  if (0 < lVar27) {
    do {
      iVar26 = (int)uVar33;
      if (*(char *)(lVar9 + iVar26) != '\0') {
        puVar15[UF::length_] = UF::length_;
        uVar32 = UF::length_ + 1;
        *(uint *)(lVar11 + (long)iVar26 * 4) = UF::length_;
        UF::length_ = uVar32;
        if (iVar16 <= iVar26 + 1) break;
        uVar33 = (ulong)(iVar26 + 1);
        while (*(char *)(lVar9 + uVar33) != '\0') {
          *(undefined4 *)(lVar11 + uVar33 * 4) =
               *(undefined4 *)(lVar11 + (long)((int)uVar33 + -1) * 4);
          uVar33 = uVar33 + 1;
          if (iVar16 == (int)uVar33) goto LAB_00198ad5;
        }
      }
      uVar32 = (int)uVar33 + 1;
      uVar33 = (ulong)uVar32;
    } while ((int)uVar32 < iVar16);
  }
LAB_00198ad5:
  if (1 < (int)uVar6) {
    lVar13 = *plVar10;
    lVar14 = *plVar12;
    lVar31 = lVar13 + 1 + lVar9;
    lVar20 = lVar11 + lVar14 + 4;
    uVar33 = 1;
    lVar22 = lVar9;
    lVar23 = lVar11;
    local_80 = lVar11;
    do {
      local_80 = local_80 + lVar14;
      lVar2 = lVar9 + lVar13 * uVar33;
      pcVar3 = (char *)(lVar2 - lVar13);
      puVar19 = (uint *)(lVar14 * uVar33 + lVar11);
      puVar18 = (uint *)((long)puVar19 - lVar14);
      cVar5 = *(char *)(lVar9 + lVar13 * uVar33);
      local_78 = (int)(lVar27 + -1);
      if (local_78 == 0) {
        if (cVar5 != '\0') {
          if (*pcVar3 == '\0') {
            puVar15[UF::length_] = UF::length_;
            uVar32 = UF::length_ + 1;
            *puVar19 = UF::length_;
            UF::length_ = uVar32;
          }
          else {
            *puVar19 = *puVar18;
          }
        }
      }
      else {
        if (cVar5 == '\0') {
          uVar28 = 0;
          goto LAB_00198bde;
        }
        if (*pcVar3 == '\0') {
          if (pcVar3[1] == '\0') {
            puVar15[UF::length_] = UF::length_;
            uVar32 = UF::length_ + 1;
            *puVar19 = UF::length_;
            UF::length_ = uVar32;
            local_b0 = 0;
            goto LAB_00198e0e;
          }
          *puVar19 = puVar18[1];
          iVar16 = 0;
          goto LAB_00198f4b;
        }
        *puVar19 = *puVar18;
        uVar28 = 0;
LAB_00198f7e:
        iVar16 = (int)uVar28;
        iVar26 = iVar16 + 1;
        local_b0 = iVar16;
        if (iVar26 < local_78) {
          lVar21 = (long)iVar16;
          lVar17 = lVar20 + lVar21 * 4;
          lVar30 = 0;
          while( true ) {
            iVar26 = (int)(lVar21 + 1);
            if (*(char *)(lVar31 + lVar21 + lVar30) == '\0') {
              uVar28 = (ulong)(uint)(iVar26 + (int)lVar30);
              goto LAB_00198bde;
            }
            if (*(char *)(lVar22 + lVar21 + 1 + lVar30) == '\0') break;
            *(undefined4 *)(lVar17 + lVar30 * 4) =
                 *(undefined4 *)(lVar23 + lVar21 * 4 + 4 + lVar30 * 4);
            lVar30 = lVar30 + 1;
            if ((lVar21 - lVar27) + 2 + lVar30 == 0) {
              iVar26 = iVar26 + (int)lVar30;
              local_b0 = iVar16 + (int)lVar30;
              goto LAB_00199043;
            }
          }
          uVar28 = lVar21 + 1 + lVar30;
          local_b0 = (int)uVar28;
          iVar16 = iVar16 + (int)lVar30;
          iVar26 = iVar16 + 2;
          if (pcVar3[iVar26] == '\0') {
            *(uint *)(lVar17 + lVar30 * 4) = puVar19[iVar16];
            goto LAB_00198e0e;
          }
          uVar32 = puVar19[iVar16];
          do {
            uVar25 = uVar32;
            uVar32 = puVar15[uVar25];
            uVar24 = puVar18[iVar26];
          } while (puVar15[uVar25] < uVar25);
          do {
            uVar32 = uVar24;
            uVar24 = puVar15[uVar32];
          } while (puVar15[uVar32] < uVar32);
          uVar24 = uVar32;
          if (uVar25 >= uVar32 && uVar25 != uVar32) {
            uVar24 = uVar25;
          }
          if (uVar25 < uVar32) {
            uVar32 = uVar25;
          }
          puVar15[uVar24] = uVar32;
          *(uint *)(lVar17 + lVar30 * 4) = uVar32;
LAB_00198f46:
          iVar16 = (int)uVar28;
LAB_00198f4b:
          lVar17 = (long)iVar16;
          uVar28 = lVar17 + 1;
          cVar5 = *(char *)(lVar2 + 1 + lVar17);
          if ((int)uVar28 < local_78) {
            if (cVar5 == '\0') {
LAB_00198bde:
              lVar30 = (long)(int)uVar28;
              lVar17 = 0;
              lVar21 = lVar30 << 0x20;
              do {
                lVar34 = lVar21;
                lVar29 = lVar34 >> 0x20;
                if (lVar27 + -1 <= lVar30 + lVar17 + 1) {
                  lVar17 = lVar34 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar2 + lVar17) == '\0') goto LAB_001990f4;
                  if (pcVar3[lVar17] != '\0') goto LAB_00199061;
                  if (pcVar3[lVar29] == '\0') {
                    puVar15[UF::length_] = UF::length_;
                    uVar32 = UF::length_ + 1;
                    puVar19[lVar17] = UF::length_;
                    UF::length_ = uVar32;
                    goto LAB_001990f4;
                  }
                  uVar32 = puVar18[lVar29];
                  goto LAB_001990f1;
                }
                lVar1 = lVar17 + 1;
                pcVar4 = (char *)(lVar30 + lVar31 + lVar17);
                lVar17 = lVar1;
                lVar21 = lVar34 + 0x100000000;
              } while (*pcVar4 == '\0');
              uVar28 = (uVar28 & 0xffffffff) + lVar1;
              if (*(char *)(lVar1 + lVar22 + lVar30) != '\0') {
                *(undefined4 *)(local_80 + lVar30 * 4 + lVar1 * 4) =
                     *(undefined4 *)(lVar23 + lVar30 * 4 + lVar1 * 4);
                goto LAB_00198f7e;
              }
              lVar17 = lVar34 + 0x200000000 >> 0x20;
              if (pcVar3[lVar17] == '\0') {
                if (pcVar3[lVar29] == '\0') {
                  puVar15[UF::length_] = UF::length_;
                  uVar32 = UF::length_ + 1;
                  *(uint *)(local_80 + lVar30 * 4 + lVar1 * 4) = UF::length_;
                  UF::length_ = uVar32;
                }
                else {
                  *(uint *)(local_80 + lVar30 * 4 + lVar1 * 4) = puVar18[lVar29];
                }
                local_b0 = (int)uVar28;
LAB_00198e0e:
                iVar16 = local_b0 + 1;
                if (local_78 <= iVar16) {
LAB_00198eaf:
                  lVar17 = (long)iVar16;
                  if (*(char *)(lVar2 + lVar17) != '\0') goto LAB_001990ee;
                  goto LAB_001990f4;
                }
                lVar34 = (long)local_b0;
                lVar17 = lVar34 << 0x20;
                lVar30 = lVar34 * 4 + lVar20;
                lVar21 = 0;
                while( true ) {
                  iVar16 = (int)(lVar34 + 1);
                  if (*(char *)(lVar34 + lVar31 + lVar21) == '\0') goto LAB_00198ec4;
                  if (*(char *)(lVar22 + lVar34 + 2 + lVar21) != '\0') break;
                  *(undefined4 *)(lVar30 + lVar21 * 4) = *(undefined4 *)(lVar30 + -4 + lVar21 * 4);
                  lVar17 = lVar17 + 0x100000000;
                  lVar21 = lVar21 + 1;
                  if ((lVar27 + -2) - lVar34 == lVar21) {
                    local_b0 = local_b0 + (int)lVar21;
                    iVar16 = iVar16 + (int)lVar21;
                    goto LAB_00198eaf;
                  }
                }
                uVar32 = *(uint *)((long)puVar19 + (lVar17 >> 0x1e));
                do {
                  uVar24 = uVar32;
                  uVar32 = puVar15[uVar24];
                } while (puVar15[uVar24] < uVar24);
                uVar28 = lVar34 + 1 + lVar21;
                uVar32 = *(uint *)(lVar23 + lVar34 * 4 + 8 + lVar21 * 4);
                do {
                  uVar25 = uVar32;
                  uVar32 = puVar15[uVar25];
                } while (puVar15[uVar25] < uVar25);
                uVar32 = uVar25;
                if (uVar24 >= uVar25 && uVar24 != uVar25) {
                  uVar32 = uVar24;
                }
                if (uVar24 < uVar25) {
                  uVar25 = uVar24;
                }
                puVar15[uVar32] = uVar25;
                *(uint *)(lVar30 + lVar21 * 4) = uVar25;
              }
              else if (pcVar3[lVar29] == '\0') {
                *(uint *)(local_80 + lVar30 * 4 + lVar1 * 4) = puVar18[lVar17];
              }
              else {
                uVar32 = puVar18[lVar29];
                do {
                  uVar25 = uVar32;
                  uVar32 = puVar15[uVar25];
                  uVar24 = puVar18[lVar17];
                } while (puVar15[uVar25] < uVar25);
                do {
                  uVar32 = uVar24;
                  uVar24 = puVar15[uVar32];
                } while (puVar15[uVar32] < uVar32);
                uVar24 = uVar32;
                if (uVar25 >= uVar32 && uVar25 != uVar32) {
                  uVar24 = uVar25;
                }
                if (uVar25 < uVar32) {
                  uVar32 = uVar25;
                }
                puVar15[uVar24] = uVar32;
                *(uint *)(local_80 + lVar30 * 4 + lVar1 * 4) = uVar32;
              }
              goto LAB_00198f46;
            }
            puVar19[lVar17 + 1] = puVar18[lVar17 + 1];
            goto LAB_00198f7e;
          }
          if (cVar5 != '\0') {
            puVar19[lVar17 + 1] = puVar18[lVar17 + 1];
          }
        }
        else {
LAB_00199043:
          lVar17 = (long)iVar26;
          if (*(char *)(lVar2 + lVar17) != '\0') {
            if (pcVar3[lVar17] == '\0') {
LAB_001990ee:
              uVar32 = puVar19[local_b0];
            }
            else {
LAB_00199061:
              uVar32 = puVar18[lVar17];
            }
LAB_001990f1:
            puVar19[lVar17] = uVar32;
          }
        }
      }
LAB_001990f4:
      uVar33 = uVar33 + 1;
      lVar23 = lVar23 + lVar14;
      lVar22 = lVar22 + lVar13;
      lVar31 = lVar31 + lVar13;
      lVar20 = lVar20 + lVar14;
    } while (uVar33 != uVar6);
  }
  return;
LAB_00198ec4:
  uVar28 = (ulong)(uint)(iVar16 + (int)lVar21);
  goto LAB_00198bde;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }